

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesDH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  size_t *psVar1;
  long lVar2;
  ulong uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ushort uVar6;
  uint32_t uVar7;
  size_t sVar8;
  size_t sVar9;
  uint16_t *puVar10;
  uint32_t *puVar11;
  BrotliEncoderDictionary *pBVar12;
  void *pvVar13;
  void *pvVar14;
  PreparedDictionary *pPVar15;
  ulong uVar16;
  HasherCommon *pHVar17;
  BrotliDictionary *pBVar18;
  undefined8 uVar19;
  bool bVar20;
  ulong uVar21;
  int iVar22;
  byte bVar23;
  uint uVar24;
  uint32_t uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  ulong *puVar32;
  byte bVar33;
  long lVar34;
  ulong uVar35;
  Hasher *pHVar36;
  ulong uVar37;
  ulong *puVar38;
  ulong uVar39;
  uint uVar40;
  int iVar41;
  long lVar42;
  ulong *puVar43;
  Hasher *unaff_RBX;
  short sVar44;
  uint uVar45;
  Hasher *pHVar46;
  ulong uVar47;
  byte bVar48;
  Hasher *pHVar49;
  Hasher *pHVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  uint8_t *puVar55;
  int iVar56;
  uint8_t *s1_orig_2;
  uint *puVar57;
  ulong *puVar58;
  Hasher *pHVar59;
  Hasher *pHVar60;
  ulong uVar61;
  size_t sVar62;
  size_t sVar63;
  int iVar64;
  bool bVar65;
  uint16_t *num;
  Hasher *local_190;
  Hasher *local_180;
  Hasher *local_178;
  int local_16c;
  Hasher *local_168;
  Hasher *local_160;
  ulong local_158;
  ulong local_138;
  ulong local_128;
  ulong local_108;
  Hasher *local_f8;
  uint local_ec;
  Hasher *local_e8;
  ulong local_a8;
  uint8_t *s1_orig;
  int last_distance;
  uint32_t *buckets;
  
  iVar41 = params->lgwin;
  sVar8 = params->stream_offset;
  uVar51 = *last_insert_len;
  uVar26 = (position - 3) + num_bytes;
  if (num_bytes < 4) {
    uVar26 = position;
  }
  lVar34 = 0x200;
  if (params->quality < 9) {
    lVar34 = 0x40;
  }
  uVar3 = position + num_bytes;
  sVar9 = (params->dictionary).compound.total_size;
  iVar56 = (hasher->privat)._H5.num_last_distances_to_check_;
  if (4 < iVar56) {
    iVar64 = *dist_cache;
    dist_cache[4] = iVar64 + -1;
    dist_cache[5] = iVar64 + 1;
    dist_cache[6] = iVar64 + -2;
    dist_cache[7] = iVar64 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar64 + 3,iVar64 + -3);
    if (10 < iVar56) {
      iVar56 = dist_cache[1];
      dist_cache[10] = iVar56 + -1;
      dist_cache[0xb] = iVar56 + 1;
      dist_cache[0xc] = iVar56 + -2;
      dist_cache[0xd] = iVar56 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar56 + 3,iVar56 + -3);
    }
  }
  if (position + 4 < uVar3) {
    uVar5 = (1L << ((byte)iVar41 & 0x3f)) - 0x10;
    local_108 = lVar34 + position;
    puVar10 = (hasher->privat)._H5.num_;
    puVar11 = (hasher->privat)._H5.buckets_;
    lVar42 = sVar9 + 1;
    local_e8 = (Hasher *)commands;
    local_158 = position;
    do {
      uVar30 = uVar5;
      if (local_158 < uVar5) {
        uVar30 = local_158;
      }
      uVar39 = local_158 + sVar8;
      if (uVar5 <= local_158 + sVar8) {
        uVar39 = uVar5;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_ec = 0;
        local_a8 = 0;
      }
      else {
        if (local_158 == 0) {
          local_a8 = 0;
        }
        else {
          local_a8 = (ulong)ringbuffer[local_158 + -1 & ringbuffer_mask];
        }
        if (local_158 < 2) {
          uVar27 = 0;
        }
        else {
          uVar27 = (ulong)ringbuffer[local_158 + -2 & ringbuffer_mask];
        }
        local_ec = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar27 + 0x100] | literal_context_lut[local_a8]];
      }
      local_180 = (Hasher *)(uVar3 - local_158);
      pBVar12 = (params->dictionary).contextual.dict[local_ec];
      uVar27 = (params->dist).max_distance;
      uVar52 = local_158 & ringbuffer_mask;
      uVar53 = (ulong)(hasher->privat)._H5.num_last_distances_to_check_;
      pHVar50 = local_180;
      if (uVar53 == 0) {
        local_168 = (Hasher *)0x7e4;
        local_128 = 0;
        local_178 = (Hasher *)0x0;
        pHVar46 = (Hasher *)0x0;
      }
      else {
        local_168 = (Hasher *)0x7e4;
        pHVar46 = (Hasher *)0x0;
        uVar61 = 0;
        local_178 = (Hasher *)0x0;
        local_128 = 0;
        do {
          uVar28 = (ulong)dist_cache[uVar61];
          if (((uVar28 <= uVar30) && (local_158 - uVar28 < local_158)) &&
             (puVar55 = (uint8_t *)((long)(pHVar46->common).extra + uVar52),
             puVar55 <= ringbuffer_mask)) {
            uVar35 = local_158 - uVar28 & ringbuffer_mask;
            pHVar50 = (Hasher *)((long)(pHVar46->common).extra + uVar35);
            if ((pHVar50 <= ringbuffer_mask) &&
               (ringbuffer[(long)puVar55] == ringbuffer[(long)pHVar50])) {
              pHVar36 = (Hasher *)(ringbuffer + uVar35);
              pHVar49 = local_180;
              unaff_RBX = (Hasher *)(ringbuffer + uVar52);
              pHVar50 = pHVar36;
              for (pHVar59 = local_180; (Hasher *)0x7 < pHVar59;
                  pHVar59 = (Hasher *)((long)&pHVar59[-1].privat + 0x418)) {
                pvVar13 = (unaff_RBX->common).extra[0];
                pvVar14 = (pHVar50->common).extra[0];
                if (pvVar13 == pvVar14) {
                  pHVar50 = (Hasher *)((pHVar50->common).extra + 1);
                }
                else {
                  uVar35 = 0;
                  if (((ulong)pvVar14 ^ (ulong)pvVar13) != 0) {
                    for (; (((ulong)pvVar14 ^ (ulong)pvVar13) >> uVar35 & 1) == 0;
                        uVar35 = uVar35 + 1) {
                    }
                  }
                  pHVar49 = (Hasher *)((long)pHVar50 + ((uVar35 >> 3 & 0x1fffffff) - (long)pHVar36))
                  ;
                }
                if (pvVar13 != pvVar14) goto LAB_0030215a;
                unaff_RBX = (Hasher *)((unaff_RBX->common).extra + 1);
              }
              if (pHVar59 != (Hasher *)0x0) {
                pHVar49 = (Hasher *)0x0;
                do {
                  pHVar60 = pHVar49;
                  if (*(uint8_t *)((long)(pHVar50->common).extra + (long)(pHVar49->common).extra) !=
                      *(uint8_t *)((long)(unaff_RBX->common).extra + (long)(pHVar49->common).extra))
                  break;
                  pHVar49 = (Hasher *)((long)(pHVar49->common).extra + 1);
                  pHVar60 = pHVar59;
                } while (pHVar59 != pHVar49);
                pHVar50 = (Hasher *)((long)(pHVar50->common).extra + (long)(pHVar60->common).extra);
              }
              pHVar49 = (Hasher *)((long)pHVar50 - (long)pHVar36);
              pHVar50 = pHVar49;
LAB_0030215a:
              if ((((Hasher *)0x2 < pHVar49) || ((uVar61 < 2 && (pHVar49 == (Hasher *)0x2)))) &&
                 (pHVar50 = (Hasher *)((long)pHVar49 * 0x87 + 0x78f), local_168 < pHVar50)) {
                if (uVar61 != 0) {
                  unaff_RBX = (Hasher *)(ulong)((0x1ca10U >> ((byte)uVar61 & 0xe) & 0xe) + 0x27);
                  pHVar50 = (Hasher *)((long)pHVar50 - (long)unaff_RBX);
                }
                if (local_168 < pHVar50) {
                  pHVar46 = pHVar49;
                  local_178 = pHVar49;
                  local_168 = pHVar50;
                  local_128 = uVar28;
                }
              }
            }
          }
          uVar61 = uVar61 + 1;
        } while (uVar61 != uVar53);
      }
      uVar45 = (uint)(*(int *)(ringbuffer + uVar52) * 0x1e35a7bd) >>
               (*(byte *)((long)&hasher->privat + 0x10) & 0x1f);
      puVar29 = (ulong *)(ringbuffer + uVar52);
      uVar24 = uVar45 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f);
      uVar6 = puVar10[uVar45];
      uVar28 = (ulong)uVar6;
      uVar53 = (hasher->privat)._H5.block_size_;
      uVar61 = 0;
      if (uVar53 <= uVar28) {
        uVar61 = uVar28 - uVar53;
      }
      do {
        if (uVar28 <= uVar61) break;
        uVar28 = uVar28 - 1;
        pHVar50 = (Hasher *)
                  (ulong)puVar11[(ulong)uVar24 +
                                 (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar28)];
        uVar35 = local_158 - (long)pHVar50;
        if ((uVar35 <= uVar30) &&
           (puVar55 = (uint8_t *)((long)(pHVar46->common).extra + uVar52),
           puVar55 <= ringbuffer_mask)) {
          pHVar50 = (Hasher *)
                    (ulong)(puVar11[(ulong)uVar24 +
                                    (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar28)] &
                           (uint)ringbuffer_mask);
          puVar4 = (uint8_t *)((long)(pHVar50->common).extra + (long)(pHVar46->common).extra);
          if ((puVar4 <= ringbuffer_mask) && (ringbuffer[(long)puVar55] == ringbuffer[(long)puVar4])
             ) {
            pHVar50 = (Hasher *)(ringbuffer + (long)&pHVar50->common);
            puVar58 = puVar29;
            pHVar49 = pHVar50;
            for (pHVar59 = local_180; (Hasher *)0x7 < pHVar59;
                pHVar59 = (Hasher *)((long)&pHVar59[-1].privat + 0x418)) {
              pvVar13 = (void *)*puVar58;
              pvVar14 = (pHVar49->common).extra[0];
              if (pvVar13 == pvVar14) {
                pHVar49 = (Hasher *)((pHVar49->common).extra + 1);
              }
              else {
                uVar31 = 0;
                if (((ulong)pvVar14 ^ (ulong)pvVar13) != 0) {
                  for (; (((ulong)pvVar14 ^ (ulong)pvVar13) >> uVar31 & 1) == 0; uVar31 = uVar31 + 1
                      ) {
                  }
                }
                unaff_RBX = (Hasher *)((long)pHVar49 + ((uVar31 >> 3 & 0x1fffffff) - (long)pHVar50))
                ;
              }
              if (pvVar13 != pvVar14) goto LAB_00302334;
              puVar58 = puVar58 + 1;
            }
            pHVar36 = pHVar49;
            if (pHVar59 != (Hasher *)0x0) {
              pHVar36 = (Hasher *)((long)(pHVar49->common).extra + (long)(pHVar59->common).extra);
              pHVar60 = (Hasher *)0x0;
              do {
                if (*(uint8_t *)((long)(pHVar49->common).extra + (long)(pHVar60->common).extra) !=
                    *(uint8_t *)((long)puVar58 + (long)pHVar60)) {
                  pHVar36 = (Hasher *)
                            ((long)(pHVar49->common).extra + (long)(pHVar60->common).extra);
                  break;
                }
                pHVar60 = (Hasher *)((long)(pHVar60->common).extra + 1);
              } while (pHVar59 != pHVar60);
            }
            unaff_RBX = (Hasher *)((long)pHVar36 - (long)pHVar50);
LAB_00302334:
            if ((Hasher *)0x3 < unaff_RBX) {
              pHVar50 = (Hasher *)((long)unaff_RBX * 0x87);
              iVar41 = 0x1f;
              if ((uint)uVar35 != 0) {
                for (; (uint)uVar35 >> iVar41 == 0; iVar41 = iVar41 + -1) {
                }
              }
              pHVar59 = (Hasher *)((long)(pHVar50->common).extra + (ulong)(iVar41 * -0x1e + 0x780));
              if (local_168 < pHVar59) {
                pHVar46 = unaff_RBX;
                local_178 = unaff_RBX;
                local_168 = pHVar59;
                local_128 = uVar35;
              }
            }
          }
        }
      } while (uVar35 <= uVar30);
      puVar11[(ulong)uVar24 + (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar6)] =
           (uint32_t)local_158;
      puVar10[uVar45] = uVar6 + 1;
      if ((local_168 == (Hasher *)0x7e4) &&
         (unaff_RBX = (Hasher *)(hasher->privat)._H5.common_,
         (unaff_RBX->common).dict_num_lookups >> 7 <= (unaff_RBX->common).dict_num_matches)) {
        uVar30 = (ulong)((uint)((int)*puVar29 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        puVar55 = pBVar12->hash_table_lengths;
        sVar62 = (unaff_RBX->common).dict_num_lookups;
        local_16c = 0;
        lVar54 = 0;
        do {
          sVar62 = sVar62 + 1;
          (unaff_RBX->common).dict_num_lookups = sVar62;
          bVar33 = puVar55[uVar30];
          pHVar46 = (Hasher *)(ulong)bVar33;
          if (pHVar46 != (Hasher *)0x0) {
            bVar65 = true;
            if (pHVar46 <= local_180) {
              pBVar18 = pBVar12->words;
              puVar38 = (ulong *)(pBVar18->data +
                                 (ulong)pBVar18->offsets_by_length[(long)pHVar46] +
                                 (ulong)pBVar12->hash_table_words[uVar30] * (long)pHVar46);
              puVar58 = puVar29;
              pHVar59 = pHVar46;
              if (7 < bVar33) {
                do {
                  uVar61 = *puVar38;
                  uVar28 = *puVar58;
                  if (uVar61 == uVar28) {
                    puVar58 = puVar58 + 1;
                  }
                  else {
                    uVar35 = 0;
                    if ((uVar28 ^ uVar61) != 0) {
                      for (; ((uVar28 ^ uVar61) >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    pHVar50 = (Hasher *)
                              ((long)puVar58 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar29));
                  }
                  if (uVar61 != uVar28) goto LAB_003024eb;
                  puVar38 = puVar38 + 1;
                  pHVar59 = (Hasher *)((long)&pHVar59[-1].privat + 0x418);
                } while ((Hasher *)0x7 < pHVar59);
              }
              puVar43 = puVar58;
              if (pHVar59 != (Hasher *)0x0) {
                puVar43 = (ulong *)((long)puVar58 + (long)pHVar59);
                pHVar50 = (Hasher *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar58 + (long)pHVar50) !=
                      *(uint8_t *)((long)puVar38 + (long)pHVar50)) {
                    puVar43 = (ulong *)((long)puVar58 + (long)pHVar50);
                    break;
                  }
                  pHVar50 = (Hasher *)((long)(pHVar50->common).extra + 1);
                } while (pHVar59 != pHVar50);
              }
              pHVar50 = (Hasher *)((long)puVar43 - (long)puVar29);
LAB_003024eb:
              if (((pHVar50 != (Hasher *)0x0) &&
                  (pHVar46 < (Hasher *)
                             ((long)(pHVar50->common).extra + (ulong)pBVar12->cutoffTransformsCount)
                  )) && (uVar61 = uVar39 + ((ulong)((uint)(pBVar12->cutoffTransforms >>
                                                          ((char)((long)pHVar46 - (long)pHVar50) *
                                                           '\x06' & 0x3fU)) & 0x3f) +
                                            ((long)pHVar46 - (long)pHVar50) * 4 <<
                                           (*(byte *)((long)(pHVar46->common).extra + (long)pBVar18)
                                           & 0x3f)) +
                                           (ulong)pBVar12->hash_table_words[uVar30] + lVar42,
                        uVar61 <= uVar27)) {
                iVar41 = 0x1f;
                if ((uint)uVar61 != 0) {
                  for (; (uint)uVar61 >> iVar41 == 0; iVar41 = iVar41 + -1) {
                  }
                }
                pHVar46 = (Hasher *)(((long)pHVar50 * 0x87 - (ulong)(uint)(iVar41 * 0x1e)) + 0x780);
                if (local_168 <= pHVar46) {
                  local_16c = (uint)bVar33 - (int)pHVar50;
                  bVar65 = false;
                  local_178 = pHVar50;
                  local_168 = pHVar46;
                  local_128 = uVar61;
                }
              }
            }
            if (!bVar65) {
              psVar1 = &(unaff_RBX->common).dict_num_matches;
              *psVar1 = *psVar1 + 1;
            }
          }
          uVar30 = uVar30 + 1;
          bVar65 = lVar54 == 0;
          lVar54 = lVar54 + 1;
        } while (bVar65);
      }
      else {
        local_16c = 0;
      }
      pHVar50 = (Hasher *)(params->dictionary).compound.num_chunks;
      sVar62 = (params->dictionary).compound.total_size;
      if (pHVar50 != (Hasher *)0x0) {
        unaff_RBX = (Hasher *)0x0;
        do {
          pPVar15 = (params->dictionary).compound.chunks[(long)unaff_RBX];
          bVar33 = (byte)pPVar15->bucket_bits;
          bVar48 = (byte)pPVar15->slot_bits;
          lVar54 = 1L << (bVar33 & 0x3f);
          bVar23 = -(char)pPVar15->hash_bits;
          uVar30 = ((*puVar29 << (bVar23 & 0x3f)) >> (bVar23 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                   (-bVar33 & 0x3f);
          pHVar46 = (Hasher *)(&pPVar15[1].magic + (1L << (bVar48 & 0x3f)));
          bVar48 = -bVar48;
          puVar55 = (uint8_t *)
                    ((long)(pHVar46->common).extra + (ulong)pPVar15->num_items * 4 + lVar54 * 2);
          if (pPVar15->magic != 0xdebcede0) {
            puVar55 = *(uint8_t **)puVar55;
          }
          uVar28 = uVar39 + (sVar62 - (params->dictionary).compound.chunk_offsets[(long)unaff_RBX]);
          uVar61 = (ulong)pPVar15->source_size;
          uVar6 = *(ushort *)((long)(pHVar46->common).extra + (uVar30 & 0xffffffff) * 2);
          puVar57 = (uint *)((long)(pHVar46->common).extra +
                            (ulong)((uint)uVar6 +
                                   (&pPVar15[1].magic)
                                   [(uint)((int)uVar30 << (bVar48 & 0x1f)) >> (bVar48 & 0x1f)]) * 4
                            + lVar54 * 2);
          lVar54 = 0;
          local_f8 = local_178;
          do {
            uVar30 = (ulong)dist_cache[lVar54];
            if ((uVar28 - uVar61 < uVar30) && (uVar30 <= uVar28)) {
              pHVar59 = (Hasher *)(uVar61 - (uVar28 - uVar30));
              if (local_180 <= pHVar59) {
                pHVar59 = local_180;
              }
              puVar43 = (ulong *)(puVar55 + (uVar28 - uVar30));
              puVar58 = puVar29;
              puVar38 = puVar43;
              for (; (Hasher *)0x7 < pHVar59;
                  pHVar59 = (Hasher *)((long)&pHVar59[-1].privat + 0x418)) {
                uVar35 = *puVar58;
                uVar31 = *puVar38;
                if (uVar35 == uVar31) {
                  puVar38 = puVar38 + 1;
                }
                else {
                  uVar37 = 0;
                  if ((uVar31 ^ uVar35) != 0) {
                    for (; ((uVar31 ^ uVar35) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  pHVar46 = (Hasher *)((long)puVar38 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar43))
                  ;
                }
                if (uVar35 != uVar31) goto LAB_0030275c;
                puVar58 = puVar58 + 1;
              }
              puVar32 = puVar38;
              if (pHVar59 != (Hasher *)0x0) {
                puVar32 = (ulong *)((long)puVar38 + (long)pHVar59);
                pHVar46 = (Hasher *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar38 + (long)pHVar46) !=
                      *(uint8_t *)((long)puVar58 + (long)pHVar46)) {
                    puVar32 = (ulong *)((long)puVar38 + (long)pHVar46);
                    break;
                  }
                  pHVar46 = (Hasher *)((long)(pHVar46->common).extra + 1);
                } while (pHVar59 != pHVar46);
              }
              pHVar46 = (Hasher *)((long)puVar32 - (long)puVar43);
LAB_0030275c:
              if (((Hasher *)0x1 < pHVar46) &&
                 (pHVar59 = (Hasher *)((long)pHVar46 * 0x87 + 0x78f), local_168 < pHVar59)) {
                if (lVar54 != 0) {
                  pHVar59 = (Hasher *)
                            ((long)pHVar59 - (ulong)((0x1ca10U >> ((byte)lVar54 & 2) & 4) + 0x27));
                }
                if (local_168 < pHVar59) {
                  if (local_178 < pHVar46) {
                    local_178 = pHVar46;
                  }
                  local_16c = 0;
                  local_168 = pHVar59;
                  local_128 = uVar30;
                  local_f8 = pHVar46;
                }
              }
            }
            lVar54 = lVar54 + 1;
          } while (lVar54 != 4);
          if (uVar6 != 0xffff) {
            do {
              uVar24 = *puVar57;
              uVar35 = (ulong)(uVar24 & 0x7fffffff);
              uVar30 = uVar28 - uVar35;
              pHVar59 = (Hasher *)(uVar61 - uVar35);
              if (local_180 <= (Hasher *)(uVar61 - uVar35)) {
                pHVar59 = local_180;
              }
              if ((((uVar30 <= uVar27) &&
                   (puVar4 = (uint8_t *)((long)(local_178->common).extra + uVar52),
                   puVar4 <= ringbuffer_mask)) && (local_178 < pHVar59)) &&
                 (ringbuffer[(long)puVar4] ==
                  puVar55[(long)((long)(local_178->common).extra + uVar35)])) {
                puVar43 = (ulong *)(puVar55 + uVar35);
                puVar58 = puVar29;
                puVar38 = puVar43;
                for (; (Hasher *)0x7 < pHVar59;
                    pHVar59 = (Hasher *)((long)&pHVar59[-1].privat + 0x418)) {
                  uVar35 = *puVar58;
                  uVar31 = *puVar38;
                  if (uVar35 == uVar31) {
                    puVar38 = puVar38 + 1;
                  }
                  else {
                    uVar37 = 0;
                    if ((uVar31 ^ uVar35) != 0) {
                      for (; ((uVar31 ^ uVar35) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                      }
                    }
                    pHVar46 = (Hasher *)
                              ((long)puVar38 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar43));
                  }
                  if (uVar35 != uVar31) goto LAB_003028dc;
                  puVar58 = puVar58 + 1;
                }
                puVar32 = puVar38;
                if (pHVar59 != (Hasher *)0x0) {
                  puVar32 = (ulong *)((long)puVar38 + (long)pHVar59);
                  pHVar46 = (Hasher *)0x0;
                  do {
                    if (*(uint8_t *)((long)puVar38 + (long)pHVar46) !=
                        *(uint8_t *)((long)puVar58 + (long)pHVar46)) {
                      puVar32 = (ulong *)((long)puVar38 + (long)pHVar46);
                      break;
                    }
                    pHVar46 = (Hasher *)((long)(pHVar46->common).extra + 1);
                  } while (pHVar59 != pHVar46);
                }
                pHVar46 = (Hasher *)((long)puVar32 - (long)puVar43);
LAB_003028dc:
                if ((Hasher *)0x3 < pHVar46) {
                  iVar41 = 0x1f;
                  if ((uint)uVar30 != 0) {
                    for (; (uint)uVar30 >> iVar41 == 0; iVar41 = iVar41 + -1) {
                    }
                  }
                  pHVar59 = (Hasher *)((ulong)(iVar41 * -0x1e + 0x780) + (long)pHVar46 * 0x87);
                  if (local_168 < pHVar59) {
                    local_16c = 0;
                    local_178 = pHVar46;
                    local_168 = pHVar59;
                    local_128 = uVar30;
                    local_f8 = pHVar46;
                  }
                }
              }
              puVar57 = puVar57 + 1;
            } while (-1 < (int)uVar24);
          }
          unaff_RBX = (Hasher *)((long)(unaff_RBX->common).extra + 1);
          local_178 = local_f8;
        } while (unaff_RBX != pHVar50);
      }
      if (local_168 < (Hasher *)0x7e5) {
        uVar51 = uVar51 + 1;
        position = local_158 + 1;
        if (local_108 < position) {
          if (local_108 + (uint)((int)lVar34 * 4) < position) {
            uVar30 = local_158 + 0x11;
            if (uVar3 + -4 <= local_158 + 0x11) {
              uVar30 = uVar3 + -4;
            }
            if (position < uVar30) {
              uVar25 = (hasher->privat)._H35.hb.state;
              uVar24 = (hasher->privat)._H5.block_mask_;
              uVar7 = (hasher->privat)._H6.block_mask_;
              do {
                uVar45 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         ((byte)uVar25 & 0x1f);
                uVar6 = puVar10[uVar45];
                puVar11[(ulong)(uVar24 & uVar6) + (ulong)(uVar45 << ((byte)uVar7 & 0x1f))] =
                     (uint32_t)position;
                puVar10[uVar45] = uVar6 + 1;
                uVar51 = uVar51 + 4;
                position = position + 4;
                unaff_RBX = (Hasher *)ringbuffer;
              } while (position < uVar30);
            }
          }
          else {
            uVar30 = local_158 + 9;
            if (uVar3 + -3 <= local_158 + 9) {
              uVar30 = uVar3 + -3;
            }
            if (position < uVar30) {
              uVar25 = (hasher->privat)._H35.hb.state;
              uVar24 = (hasher->privat)._H5.block_mask_;
              uVar7 = (hasher->privat)._H6.block_mask_;
              do {
                uVar45 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         ((byte)uVar25 & 0x1f);
                uVar6 = puVar10[uVar45];
                puVar11[(ulong)(uVar24 & uVar6) + (ulong)(uVar45 << ((byte)uVar7 & 0x1f))] =
                     (uint32_t)position;
                puVar10[uVar45] = uVar6 + 1;
                uVar51 = uVar51 + 2;
                position = position + 2;
                unaff_RBX = (Hasher *)ringbuffer;
              } while (position < uVar30);
            }
          }
        }
      }
      else {
        iVar41 = (hasher->privat)._H5.num_last_distances_to_check_;
        uVar25 = (hasher->privat)._H35.hb.state;
        uVar24 = (hasher->privat)._H5.block_mask_;
        uVar7 = (hasher->privat)._H6.block_mask_;
        iVar56 = 0;
        do {
          uVar30 = local_158;
          local_180 = (Hasher *)((long)&local_180[-1].privat + 0x41f);
          pHVar46 = (Hasher *)((long)&local_178[-1].privat + 0x41f);
          if (local_180 <= pHVar46) {
            pHVar46 = local_180;
          }
          if (4 < params->quality) {
            pHVar46 = (Hasher *)0x0;
          }
          uVar39 = local_158 + 1;
          uVar52 = uVar5;
          if (uVar39 < uVar5) {
            uVar52 = uVar39;
          }
          uVar61 = local_158 + sVar8 + 1;
          if (uVar5 <= uVar61) {
            uVar61 = uVar5;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_ec = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_a8 + 0x100] |
                              literal_context_lut[ringbuffer[local_158 & ringbuffer_mask]]];
            local_a8 = (ulong)ringbuffer[local_158 & ringbuffer_mask];
          }
          uVar28 = uVar39 & ringbuffer_mask;
          pBVar12 = (params->dictionary).contextual.dict[local_ec];
          if (iVar41 == 0) {
            local_190 = (Hasher *)0x7e4;
            local_138 = 0;
            local_160 = (Hasher *)0x0;
          }
          else {
            local_190 = (Hasher *)0x7e4;
            uVar35 = 0;
            local_160 = (Hasher *)0x0;
            local_138 = 0;
            do {
              uVar31 = (ulong)dist_cache[uVar35];
              if (((uVar31 <= uVar52) && (uVar39 - uVar31 < uVar39)) &&
                 (puVar55 = (uint8_t *)((long)(pHVar46->common).extra + uVar28),
                 puVar55 <= ringbuffer_mask)) {
                uVar37 = uVar39 - uVar31 & ringbuffer_mask;
                puVar4 = (uint8_t *)((long)(pHVar46->common).extra + uVar37);
                if ((puVar4 <= ringbuffer_mask) &&
                   (ringbuffer[(long)puVar55] == ringbuffer[(long)puVar4])) {
                  puVar38 = (ulong *)(ringbuffer + uVar37);
                  pHVar49 = local_180;
                  puVar29 = (ulong *)(ringbuffer + uVar28);
                  puVar58 = puVar38;
                  for (pHVar59 = local_180; (Hasher *)0x7 < pHVar59;
                      pHVar59 = (Hasher *)((long)&pHVar59[-1].privat + 0x418)) {
                    uVar37 = *puVar29;
                    uVar47 = *puVar58;
                    if (uVar37 == uVar47) {
                      puVar58 = puVar58 + 1;
                    }
                    else {
                      uVar16 = 0;
                      if ((uVar47 ^ uVar37) != 0) {
                        for (; ((uVar47 ^ uVar37) >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                        }
                      }
                      pHVar49 = (Hasher *)
                                ((long)puVar58 + ((uVar16 >> 3 & 0x1fffffff) - (long)puVar38));
                    }
                    if (uVar37 != uVar47) goto LAB_00302bb5;
                    puVar29 = puVar29 + 1;
                  }
                  if (pHVar59 != (Hasher *)0x0) {
                    pHVar49 = (Hasher *)0x0;
                    do {
                      pHVar36 = pHVar49;
                      if (*(uint8_t *)((long)puVar58 + (long)pHVar49) !=
                          *(uint8_t *)((long)puVar29 + (long)pHVar49)) break;
                      pHVar49 = (Hasher *)((long)(pHVar49->common).extra + 1);
                      pHVar36 = pHVar59;
                    } while (pHVar59 != pHVar49);
                    puVar58 = (ulong *)((long)puVar58 + (long)pHVar36);
                  }
                  pHVar49 = (Hasher *)((long)puVar58 - (long)puVar38);
LAB_00302bb5:
                  if ((((Hasher *)0x2 < pHVar49) || ((uVar35 < 2 && (pHVar49 == (Hasher *)0x2)))) &&
                     (pHVar59 = (Hasher *)((long)pHVar49 * 0x87 + 0x78f), local_190 < pHVar59)) {
                    if (uVar35 != 0) {
                      pHVar59 = (Hasher *)
                                ((long)pHVar59 -
                                (ulong)((0x1ca10U >> ((byte)uVar35 & 0xe) & 0xe) + 0x27));
                    }
                    if (local_190 < pHVar59) {
                      pHVar46 = pHVar49;
                      local_160 = pHVar49;
                      local_190 = pHVar59;
                      local_138 = uVar31;
                    }
                  }
                }
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != (long)iVar41);
          }
          puVar29 = (ulong *)(ringbuffer + uVar28);
          uVar40 = (uint)(*(int *)(ringbuffer + uVar28) * 0x1e35a7bd) >> ((byte)uVar25 & 0x1f);
          uVar45 = uVar40 << ((byte)uVar7 & 0x1f);
          uVar6 = puVar10[uVar40];
          uVar31 = (ulong)uVar6;
          uVar35 = 0;
          if (uVar53 <= uVar31) {
            uVar35 = uVar31 - uVar53;
          }
          do {
            if (uVar31 <= uVar35) break;
            uVar31 = uVar31 - 1;
            uVar37 = uVar39 - puVar11[(ulong)uVar45 +
                                      (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar31)];
            if ((uVar37 <= uVar52) &&
               (puVar55 = (uint8_t *)((long)(pHVar46->common).extra + uVar28),
               puVar55 <= ringbuffer_mask)) {
              uVar47 = (ulong)(puVar11[(ulong)uVar45 +
                                       (ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar31)] &
                              (uint)ringbuffer_mask);
              puVar4 = (uint8_t *)((long)(pHVar46->common).extra + uVar47);
              if ((puVar4 <= ringbuffer_mask) &&
                 (ringbuffer[(long)puVar55] == ringbuffer[(long)puVar4])) {
                puVar43 = (ulong *)(ringbuffer + uVar47);
                puVar58 = puVar29;
                puVar38 = puVar43;
                pHVar49 = (Hasher *)ringbuffer;
                for (pHVar59 = local_180; (Hasher *)0x7 < pHVar59;
                    pHVar59 = (Hasher *)((long)&pHVar59[-1].privat + 0x418)) {
                  uVar47 = *puVar58;
                  uVar16 = *puVar38;
                  if (uVar47 == uVar16) {
                    puVar38 = puVar38 + 1;
                  }
                  else {
                    uVar21 = 0;
                    if ((uVar16 ^ uVar47) != 0) {
                      for (; ((uVar16 ^ uVar47) >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    pHVar49 = (Hasher *)
                              ((long)puVar38 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar43));
                  }
                  if (uVar47 != uVar16) goto LAB_00302d96;
                  puVar58 = puVar58 + 1;
                }
                puVar32 = puVar38;
                if (pHVar59 != (Hasher *)0x0) {
                  puVar32 = (ulong *)((long)puVar38 + (long)pHVar59);
                  pHVar49 = (Hasher *)0x0;
                  do {
                    if (*(uint8_t *)((long)puVar38 + (long)pHVar49) !=
                        *(uint8_t *)((long)puVar58 + (long)pHVar49)) {
                      puVar32 = (ulong *)((long)puVar38 + (long)pHVar49);
                      break;
                    }
                    pHVar49 = (Hasher *)((long)(pHVar49->common).extra + 1);
                  } while (pHVar59 != pHVar49);
                }
                pHVar49 = (Hasher *)((long)puVar32 - (long)puVar43);
LAB_00302d96:
                if ((Hasher *)0x3 < pHVar49) {
                  iVar64 = 0x1f;
                  if ((uint)uVar37 != 0) {
                    for (; (uint)uVar37 >> iVar64 == 0; iVar64 = iVar64 + -1) {
                    }
                  }
                  pHVar59 = (Hasher *)((ulong)(iVar64 * -0x1e + 0x780) + (long)pHVar49 * 0x87);
                  if (local_190 < pHVar59) {
                    pHVar46 = pHVar49;
                    local_160 = pHVar49;
                    local_190 = pHVar59;
                    local_138 = uVar37;
                  }
                }
              }
            }
          } while (uVar37 <= uVar52);
          puVar11[(ulong)uVar45 + (ulong)(uVar24 & uVar6)] = (uint32_t)uVar39;
          puVar10[uVar40] = uVar6 + 1;
          pHVar46 = hasher;
          if ((local_190 == (Hasher *)0x7e4) &&
             (pHVar17 = (hasher->privat)._H5.common_,
             pHVar17->dict_num_lookups >> 7 <= pHVar17->dict_num_matches)) {
            uVar52 = (ulong)((uint)((int)*puVar29 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
            puVar55 = pBVar12->hash_table_lengths;
            sVar63 = pHVar17->dict_num_lookups;
            iVar64 = 0;
            lVar54 = 0;
            do {
              sVar63 = sVar63 + 1;
              pHVar17->dict_num_lookups = sVar63;
              bVar33 = puVar55[uVar52];
              pHVar59 = (Hasher *)(ulong)bVar33;
              if (pHVar59 != (Hasher *)0x0) {
                bVar65 = true;
                if (pHVar59 <= local_180) {
                  pBVar18 = pBVar12->words;
                  puVar38 = (ulong *)(pBVar18->data +
                                     (ulong)pBVar18->offsets_by_length[(long)pHVar59] +
                                     (ulong)pBVar12->hash_table_words[uVar52] * (long)pHVar59);
                  pHVar49 = pHVar59;
                  puVar58 = puVar29;
                  if (7 < bVar33) {
                    do {
                      uVar35 = *puVar38;
                      uVar31 = *puVar58;
                      if (uVar35 == uVar31) {
                        puVar58 = puVar58 + 1;
                      }
                      else {
                        uVar37 = 0;
                        if ((uVar31 ^ uVar35) != 0) {
                          for (; ((uVar31 ^ uVar35) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                          }
                        }
                        pHVar46 = (Hasher *)
                                  ((long)puVar58 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar29));
                      }
                      if (uVar35 != uVar31) goto LAB_0030336e;
                      puVar38 = puVar38 + 1;
                      pHVar49 = (Hasher *)((long)&pHVar49[-1].privat + 0x418);
                    } while ((Hasher *)0x7 < pHVar49);
                  }
                  puVar43 = puVar58;
                  if (pHVar49 != (Hasher *)0x0) {
                    puVar43 = (ulong *)((long)puVar58 + (long)pHVar49);
                    pHVar46 = (Hasher *)0x0;
                    do {
                      if (*(uint8_t *)((long)puVar58 + (long)pHVar46) !=
                          *(uint8_t *)((long)puVar38 + (long)pHVar46)) {
                        puVar43 = (ulong *)((long)puVar58 + (long)pHVar46);
                        break;
                      }
                      pHVar46 = (Hasher *)((long)(pHVar46->common).extra + 1);
                    } while (pHVar49 != pHVar46);
                  }
                  pHVar46 = (Hasher *)((long)puVar43 - (long)puVar29);
LAB_0030336e:
                  bVar65 = true;
                  if (((pHVar46 != (Hasher *)0x0) &&
                      (pHVar59 < (Hasher *)
                                 ((long)(pHVar46->common).extra +
                                 (ulong)pBVar12->cutoffTransformsCount))) &&
                     (uVar35 = uVar61 + ((ulong)((uint)(pBVar12->cutoffTransforms >>
                                                       ((char)((long)pHVar59 - (long)pHVar46) *
                                                        '\x06' & 0x3fU)) & 0x3f) +
                                         ((long)pHVar59 - (long)pHVar46) * 4 <<
                                        (*(byte *)((long)(pHVar59->common).extra + (long)pBVar18) &
                                        0x3f)) + (ulong)pBVar12->hash_table_words[uVar52] + lVar42,
                     uVar35 <= uVar27)) {
                    iVar22 = 0x1f;
                    if ((uint)uVar35 != 0) {
                      for (; (uint)uVar35 >> iVar22 == 0; iVar22 = iVar22 + -1) {
                      }
                    }
                    pHVar59 = (Hasher *)
                              (((long)pHVar46 * 0x87 - (ulong)(uint)(iVar22 * 0x1e)) + 0x780);
                    if (local_190 <= pHVar59) {
                      iVar64 = (uint)bVar33 - (int)pHVar46;
                      bVar65 = false;
                      local_160 = pHVar46;
                      local_190 = pHVar59;
                      local_138 = uVar35;
                    }
                  }
                }
                if (!bVar65) {
                  pHVar17->dict_num_matches = pHVar17->dict_num_matches + 1;
                }
              }
              uVar52 = uVar52 + 1;
              bVar65 = lVar54 == 0;
              lVar54 = lVar54 + 1;
            } while (bVar65);
          }
          else {
            iVar64 = 0;
          }
          if (pHVar50 != (Hasher *)0x0) {
            pHVar49 = (Hasher *)0x0;
            pHVar59 = local_160;
            do {
              pPVar15 = (params->dictionary).compound.chunks[(long)pHVar49];
              bVar33 = (byte)pPVar15->bucket_bits;
              bVar48 = (byte)pPVar15->slot_bits;
              bVar23 = -(char)pPVar15->hash_bits;
              uVar52 = ((*puVar29 << (bVar23 & 0x3f)) >> (bVar23 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                       (-bVar33 & 0x3f);
              lVar54 = (1L << (bVar48 & 0x3f)) * 4;
              lVar2 = (1L << (bVar33 & 0x3f)) * 2;
              bVar48 = -bVar48;
              pHVar46 = (Hasher *)CONCAT71((int7)((ulong)pHVar46 >> 8),bVar48);
              pHVar36 = (Hasher *)
                        ((long)&pPVar15[1].magic + (ulong)pPVar15->num_items * 4 + lVar2 + lVar54);
              if (pPVar15->magic != 0xdebcede0) {
                pHVar36 = (Hasher *)(pHVar36->common).extra[0];
              }
              uVar31 = uVar61 + (sVar62 - (params->dictionary).compound.chunk_offsets[(long)pHVar49]
                                );
              uVar35 = (ulong)pPVar15->source_size;
              uVar6 = *(ushort *)((long)&pPVar15[1].magic + (uVar52 & 0xffffffff) * 2 + lVar54);
              puVar57 = (uint *)((long)&pPVar15[1].magic +
                                (ulong)((uint)uVar6 +
                                       (&pPVar15[1].magic)
                                       [(uint)((int)uVar52 << (bVar48 & 0x1f)) >> (bVar48 & 0x1f)])
                                * 4 + lVar2 + lVar54);
              lVar54 = 0;
              local_160 = pHVar59;
              do {
                uVar52 = (ulong)dist_cache[lVar54];
                if ((uVar31 - uVar35 < uVar52) && (uVar52 <= uVar31)) {
                  pHVar60 = (Hasher *)(uVar35 - (uVar31 - uVar52));
                  if (local_180 <= pHVar60) {
                    pHVar60 = local_180;
                  }
                  puVar43 = (ulong *)((uVar31 - uVar52) + (long)pHVar36);
                  puVar58 = puVar29;
                  puVar38 = puVar43;
                  for (; (Hasher *)0x7 < pHVar60;
                      pHVar60 = (Hasher *)((long)&pHVar60[-1].privat + 0x418)) {
                    uVar37 = *puVar58;
                    uVar47 = *puVar38;
                    if (uVar37 == uVar47) {
                      puVar38 = puVar38 + 1;
                    }
                    else {
                      uVar16 = 0;
                      if ((uVar47 ^ uVar37) != 0) {
                        for (; ((uVar47 ^ uVar37) >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                        }
                      }
                      pHVar46 = (Hasher *)
                                ((long)puVar38 + ((uVar16 >> 3 & 0x1fffffff) - (long)puVar43));
                    }
                    if (uVar37 != uVar47) goto LAB_00302fe1;
                    puVar58 = puVar58 + 1;
                  }
                  puVar32 = puVar38;
                  if (pHVar60 != (Hasher *)0x0) {
                    puVar32 = (ulong *)((long)puVar38 + (long)pHVar60);
                    pHVar46 = (Hasher *)0x0;
                    do {
                      if (*(uint8_t *)((long)puVar38 + (long)pHVar46) !=
                          *(uint8_t *)((long)puVar58 + (long)pHVar46)) {
                        puVar32 = (ulong *)((long)puVar38 + (long)pHVar46);
                        break;
                      }
                      pHVar46 = (Hasher *)((long)(pHVar46->common).extra + 1);
                    } while (pHVar60 != pHVar46);
                  }
                  pHVar46 = (Hasher *)((long)puVar32 - (long)puVar43);
LAB_00302fe1:
                  if (((Hasher *)0x1 < pHVar46) &&
                     (pHVar60 = (Hasher *)((long)pHVar46 * 0x87 + 0x78f), local_190 < pHVar60)) {
                    if (lVar54 != 0) {
                      pHVar60 = (Hasher *)
                                ((long)pHVar60 -
                                (ulong)((0x1ca10U >> ((byte)lVar54 & 2) & 4) + 0x27));
                    }
                    if (local_190 < pHVar60) {
                      if (pHVar59 < pHVar46) {
                        pHVar59 = pHVar46;
                      }
                      iVar64 = 0;
                      local_190 = pHVar60;
                      local_160 = pHVar46;
                      local_138 = uVar52;
                    }
                  }
                }
                lVar54 = lVar54 + 1;
              } while (lVar54 != 4);
              if (uVar6 != 0xffff) {
                do {
                  uVar45 = *puVar57;
                  uVar37 = (ulong)(uVar45 & 0x7fffffff);
                  uVar52 = uVar31 - uVar37;
                  pHVar60 = (Hasher *)(uVar35 - uVar37);
                  if (local_180 <= (Hasher *)(uVar35 - uVar37)) {
                    pHVar60 = local_180;
                  }
                  if ((((uVar52 <= uVar27) &&
                       (puVar55 = (uint8_t *)((long)(pHVar59->common).extra + uVar28),
                       puVar55 <= ringbuffer_mask)) && (pHVar59 < pHVar60)) &&
                     (pHVar46 = pHVar36,
                     ringbuffer[(long)puVar55] ==
                     ((uint8_t *)((long)(pHVar59->common).extra + uVar37))
                     [(long)(pHVar36->common).extra])) {
                    puVar43 = (ulong *)((long)(pHVar36->common).extra + uVar37);
                    puVar58 = puVar29;
                    puVar38 = puVar43;
                    for (; (Hasher *)0x7 < pHVar60;
                        pHVar60 = (Hasher *)((long)&pHVar60[-1].privat + 0x418)) {
                      uVar37 = *puVar58;
                      uVar47 = *puVar38;
                      if (uVar37 == uVar47) {
                        puVar38 = puVar38 + 1;
                      }
                      else {
                        uVar16 = 0;
                        if ((uVar47 ^ uVar37) != 0) {
                          for (; ((uVar47 ^ uVar37) >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                          }
                        }
                        pHVar46 = (Hasher *)
                                  ((long)puVar38 + ((uVar16 >> 3 & 0x1fffffff) - (long)puVar43));
                      }
                      if (uVar37 != uVar47) goto LAB_0030315a;
                      puVar58 = puVar58 + 1;
                    }
                    puVar32 = puVar38;
                    if (pHVar60 != (Hasher *)0x0) {
                      puVar32 = (ulong *)((long)puVar38 + (long)pHVar60);
                      pHVar46 = (Hasher *)0x0;
                      do {
                        if (*(uint8_t *)((long)puVar38 + (long)pHVar46) !=
                            *(uint8_t *)((long)puVar58 + (long)pHVar46)) {
                          puVar32 = (ulong *)((long)puVar38 + (long)pHVar46);
                          break;
                        }
                        pHVar46 = (Hasher *)((long)(pHVar46->common).extra + 1);
                      } while (pHVar60 != pHVar46);
                    }
                    pHVar46 = (Hasher *)((long)puVar32 - (long)puVar43);
LAB_0030315a:
                    if ((Hasher *)0x3 < pHVar46) {
                      iVar22 = 0x1f;
                      if ((uint)uVar52 != 0) {
                        for (; (uint)uVar52 >> iVar22 == 0; iVar22 = iVar22 + -1) {
                        }
                      }
                      pHVar60 = (Hasher *)((ulong)(iVar22 * -0x1e + 0x780) + (long)pHVar46 * 0x87);
                      if (local_190 < pHVar60) {
                        iVar64 = 0;
                        pHVar59 = pHVar46;
                        local_190 = pHVar60;
                        local_160 = pHVar46;
                        local_138 = uVar52;
                      }
                    }
                  }
                  puVar57 = puVar57 + 1;
                } while (-1 < (int)uVar45);
              }
              pHVar49 = (Hasher *)((long)(pHVar49->common).extra + 1);
              pHVar59 = local_160;
            } while (pHVar49 != pHVar50);
          }
          bVar65 = (Hasher *)((long)&local_168->privat + 0x5fU) <= local_190;
          iVar22 = iVar56;
          if (bVar65) {
            uVar51 = uVar51 + 1;
            local_168 = local_190;
            local_128 = local_138;
            local_178 = local_160;
            local_16c = iVar64;
            local_158 = uVar39;
            iVar22 = iVar56 + 1;
          }
          bVar20 = iVar56 < 3;
          iVar56 = iVar22;
        } while (bVar65 && (bVar20 && uVar30 + 5 < uVar3));
        uVar30 = local_158 + sVar8;
        if (uVar5 <= local_158 + sVar8) {
          uVar30 = uVar5;
        }
        uVar30 = uVar30 + sVar9;
        if (uVar30 < local_128) {
LAB_00303651:
          uVar39 = local_128 + 0xf;
        }
        else {
          uVar24 = 0;
          bVar65 = false;
          if (local_128 != (long)*dist_cache) {
            if (local_128 == (long)dist_cache[1]) {
              uVar24 = 1;
            }
            else {
              uVar39 = local_128 + (3 - (long)*dist_cache);
              if (uVar39 < 7) {
                bVar33 = (byte)((int)uVar39 << 2);
                uVar24 = 0x9750468;
              }
              else {
                uVar39 = local_128 + (3 - (long)dist_cache[1]);
                if (6 < uVar39) {
                  if (local_128 != (long)dist_cache[2]) {
                    bVar65 = local_128 != (long)dist_cache[3];
                    uVar24 = 3;
                    goto LAB_0030364d;
                  }
                  uVar24 = 2;
                  goto LAB_0030364b;
                }
                bVar33 = (byte)((int)uVar39 << 2);
                uVar24 = 0xfdb1ace;
              }
              uVar24 = uVar24 >> (bVar33 & 0x1f) & 0xf;
            }
LAB_0030364b:
            bVar65 = false;
          }
LAB_0030364d:
          if (bVar65) goto LAB_00303651;
          uVar39 = (ulong)uVar24;
        }
        if ((local_128 <= uVar30) && (uVar39 != 0)) {
          dist_cache[3] = dist_cache[2];
          uVar19 = *(undefined8 *)dist_cache;
          *(undefined8 *)(dist_cache + 1) = uVar19;
          iVar56 = (int)local_128;
          *dist_cache = iVar56;
          iVar41 = (hasher->privat)._H5.num_last_distances_to_check_;
          if (4 < iVar41) {
            dist_cache[4] = iVar56 + -1;
            dist_cache[5] = iVar56 + 1;
            dist_cache[6] = iVar56 + -2;
            dist_cache[7] = iVar56 + 2;
            dist_cache[8] = iVar56 + -3;
            dist_cache[9] = iVar56 + 3;
            if (10 < iVar41) {
              iVar41 = (int)uVar19;
              dist_cache[10] = iVar41 + -1;
              dist_cache[0xb] = iVar41 + 1;
              dist_cache[0xc] = iVar41 + -2;
              dist_cache[0xd] = iVar41 + 2;
              *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar41 + 3,iVar41 + -3);
            }
          }
        }
        uVar24 = (uint)uVar51;
        *(uint *)(local_e8->common).extra = uVar24;
        *(uint *)((long)(local_e8->common).extra + 4) = local_16c << 0x19 | (uint)local_178;
        uVar27 = (ulong)(params->dist).num_direct_distance_codes;
        uVar30 = uVar27 + 0x10;
        if (uVar39 < uVar30) {
          *(short *)((long)(local_e8->common).extra + 0xe) = (short)uVar39;
          uVar25 = 0;
        }
        else {
          uVar25 = (params->dist).distance_postfix_bits;
          bVar33 = (byte)uVar25;
          uVar39 = uVar39 + ((4L << (bVar33 & 0x3f)) - uVar27) + -0x10;
          uVar45 = 0x1f;
          if ((uint)uVar39 != 0) {
            for (; (uint)uVar39 >> uVar45 == 0; uVar45 = uVar45 - 1) {
            }
          }
          uVar45 = (uVar45 ^ 0xffffffe0) + 0x1f;
          bVar65 = (uVar39 >> ((ulong)uVar45 & 0x3f) & 1) != 0;
          iVar41 = uVar45 - uVar25;
          *(ushort *)((long)(local_e8->common).extra + 0xe) =
               (short)((uint)bVar65 + iVar41 * 2 + 0xfffe << (bVar33 & 0x3f)) +
               (short)uVar30 + (~(ushort)(-1 << (bVar33 & 0x1f)) & (ushort)uVar39) |
               (short)iVar41 * 0x400;
          uVar25 = (uint32_t)
                   (uVar39 - ((ulong)bVar65 + 2 << ((byte)uVar45 & 0x3f)) >> (bVar33 & 0x3f));
        }
        *(uint32_t *)((local_e8->common).extra + 1) = uVar25;
        if (5 < uVar51) {
          if (uVar51 < 0x82) {
            uVar24 = 0x1f;
            uVar45 = (uint)(uVar51 - 2);
            if (uVar45 != 0) {
              for (; uVar45 >> uVar24 == 0; uVar24 = uVar24 - 1) {
              }
            }
            uVar24 = (int)(uVar51 - 2 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar24 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar51 < 0x842) {
            uVar45 = 0x1f;
            if (uVar24 - 0x42 != 0) {
              for (; uVar24 - 0x42 >> uVar45 == 0; uVar45 = uVar45 - 1) {
              }
            }
            uVar24 = (uVar45 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar24 = 0x15;
            if (0x1841 < uVar51) {
              uVar24 = (uint)(ushort)(0x17 - (uVar51 < 0x5842));
            }
          }
        }
        uVar45 = local_16c + (uint)local_178;
        if (uVar45 < 10) {
          uVar40 = uVar45 - 2;
        }
        else if (uVar45 < 0x86) {
          uVar45 = uVar45 - 6;
          uVar40 = 0x1f;
          if (uVar45 != 0) {
            for (; uVar45 >> uVar40 == 0; uVar40 = uVar40 - 1) {
            }
          }
          uVar40 = (int)((ulong)(long)(int)uVar45 >> ((char)(uVar40 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar40 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar40 = 0x17;
          if (uVar45 < 0x846) {
            uVar40 = 0x1f;
            if (uVar45 - 0x46 != 0) {
              for (; uVar45 - 0x46 >> uVar40 == 0; uVar40 = uVar40 - 1) {
              }
            }
            uVar40 = (uVar40 ^ 0xffe0) + 0x2c;
          }
        }
        uVar6 = (ushort)uVar40;
        sVar44 = (uVar6 & 7) + ((ushort)uVar24 & 7) * 8;
        if ((((*(ushort *)((long)(local_e8->common).extra + 0xe) & 0x3ff) == 0) &&
            ((ushort)uVar24 < 8)) && (uVar6 < 0x10)) {
          if (7 < uVar6) {
            sVar44 = sVar44 + 0x40;
          }
        }
        else {
          iVar41 = ((uVar24 & 0xffff) >> 3) * 3 + ((uVar40 & 0xffff) >> 3);
          sVar44 = sVar44 + ((ushort)(0x520d40 >> ((char)iVar41 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar41 * 0x40 + 0x40;
        }
        *(short *)((long)(local_e8->common).extra + 0xc) = sVar44;
        *num_literals = *num_literals + uVar51;
        position = local_158 + (long)(local_178->common).extra;
        uVar51 = uVar26;
        if (position < uVar26) {
          uVar51 = position;
        }
        uVar30 = local_158 + 2;
        if (local_128 < (ulong)local_178 >> 2) {
          uVar39 = position + local_128 * -4;
          if (uVar39 < uVar30) {
            uVar39 = uVar30;
          }
          uVar30 = uVar39;
          if (uVar51 < uVar39) {
            uVar30 = uVar51;
          }
        }
        local_108 = local_158 + lVar34 + (long)local_178 * 2;
        local_e8 = (Hasher *)((local_e8->common).extra + 2);
        if (uVar30 < uVar51) {
          uVar25 = (hasher->privat)._H35.hb.state;
          uVar24 = (hasher->privat)._H5.block_mask_;
          uVar7 = (hasher->privat)._H6.block_mask_;
          do {
            uVar45 = (uint)(*(int *)(ringbuffer + (uVar30 & ringbuffer_mask)) * 0x1e35a7bd) >>
                     ((byte)uVar25 & 0x1f);
            uVar6 = puVar10[uVar45];
            unaff_RBX = (Hasher *)(ulong)(uVar45 << ((byte)uVar7 & 0x1f));
            puVar11[(long)((long)(unaff_RBX->common).extra + (ulong)(uVar24 & uVar6))] =
                 (uint32_t)uVar30;
            puVar10[uVar45] = uVar6 + 1;
            uVar30 = uVar30 + 1;
          } while (uVar51 != uVar30);
          uVar51 = 0;
        }
        else {
          uVar51 = 0;
          unaff_RBX = local_e8;
        }
      }
      local_158 = position;
    } while (position + 4 < uVar3);
  }
  else {
    local_e8 = (Hasher *)commands;
  }
  *last_insert_len = uVar3 + (uVar51 - position);
  *num_commands = *num_commands + ((long)local_e8 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}